

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgsisx.c
# Opt level: O2

void sgsisx(superlu_options_t *options,SuperMatrix *A,int *perm_c,int *perm_r,int *etree,char *equed
           ,float *R,float *C,SuperMatrix *L,SuperMatrix *U,void *work,int_t lwork,SuperMatrix *B,
           SuperMatrix *X,float *recip_pivot_growth,float *rcond,GlobalLU_t *Glu,
           mem_usage_t *mem_usage,SuperLUStat_t *stat,int_t *info)

{
  float fVar1;
  char cVar2;
  uint n;
  yes_no_t yVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  int_t *piVar7;
  undefined4 *puVar8;
  undefined1 uVar9;
  double *pdVar10;
  int iVar11;
  int *piVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  float in_XMM0_Da;
  float fVar22;
  float fVar23;
  double dVar24;
  double dVar25;
  float in_XMM1_Da;
  int *local_218;
  SuperMatrix *local_210;
  long local_1e8;
  int info1;
  float rowcnd;
  float colcnd;
  int_t *local_1d0;
  ulong local_1c8;
  double *local_1c0;
  ulong local_1b8;
  int *local_1b0;
  long local_1a8;
  trans_t local_1a0;
  fact_t local_19c;
  float *local_198;
  long local_190;
  int *local_188;
  long local_180;
  int local_174;
  int local_170;
  float amax;
  int *local_168;
  double local_160;
  SuperMatrix AC;
  char norm [1];
  undefined3 uStack_137;
  
  piVar12 = (int *)B->Store;
  piVar6 = (int *)X->Store;
  local_1e8 = *(long *)(piVar12 + 2);
  local_1a8 = *(long *)(piVar6 + 2);
  local_190 = (long)*piVar12;
  local_180 = (long)*piVar6;
  local_1c8 = (ulong)(uint)B->ncol;
  n = B->nrow;
  *info = 0;
  local_198 = (float *)CONCAT44(local_198._4_4_,options->Trans);
  bVar18 = options->Trans == NOTRANS;
  local_1d0 = (int_t *)CONCAT44(local_1d0._4_4_,options->RowPerm);
  bVar19 = options->RowPerm != LargeDiag_MC64;
  local_19c = options->Fact;
  yVar3 = options->Equil;
  local_1b0 = perm_c;
  local_188 = perm_r;
  local_168 = etree;
  if (local_19c == FACTORED) {
    cVar2 = *equed;
    if (cVar2 == 'R') {
      bVar21 = true;
LAB_00107e67:
      bVar20 = cVar2 == 'B';
    }
    else {
      bVar21 = cVar2 == 'B';
      if (cVar2 != 'C') goto LAB_00107e67;
      bVar20 = true;
    }
    in_XMM0_Da = smach("Safe minimum");
    in_XMM1_Da = 1.0 / in_XMM0_Da;
  }
  else {
    *equed = 'N';
    bVar21 = false;
    bVar20 = false;
  }
  iVar11 = -1;
  if (((options->Fact < 4) && (options->Trans < (CONJ|TRANS))) && (options->Equil < 2)) {
    iVar4 = A->nrow;
    iVar11 = -2;
    if (((-1 < (long)iVar4) && (iVar4 == A->ncol)) &&
       (((A->Stype & ~SLU_NR) == SLU_NC && ((A->Dtype == SLU_S && (A->Mtype == SLU_GE)))))) {
      if ((options->Fact != FACTORED) || (bVar20 || bVar21)) {
        if (bVar21) {
          fVar22 = 0.0;
          fVar23 = in_XMM1_Da;
          for (lVar16 = 0; iVar4 != lVar16; lVar16 = lVar16 + 1) {
            fVar1 = R[lVar16];
            if (fVar1 <= fVar23) {
              fVar23 = fVar1;
            }
            if (fVar22 <= fVar1) {
              fVar22 = fVar1;
            }
          }
          if (fVar23 <= 0.0) {
            iVar11 = -7;
            goto LAB_0010808f;
          }
          if (iVar4 < 1) {
            rowcnd = 1.0;
          }
          else {
            if (fVar23 <= in_XMM0_Da) {
              fVar23 = in_XMM0_Da;
            }
            if (in_XMM1_Da <= fVar22) {
              fVar22 = in_XMM1_Da;
            }
            rowcnd = fVar23 / fVar22;
          }
        }
        iVar11 = *info;
        if (bVar20) {
          if (iVar11 != 0) goto LAB_00108092;
          uVar5 = A->nrow;
          uVar13 = 0;
          uVar14 = 0;
          if (0 < (int)uVar5) {
            uVar14 = (ulong)uVar5;
          }
          fVar22 = 0.0;
          fVar23 = in_XMM1_Da;
          for (; uVar14 != uVar13; uVar13 = uVar13 + 1) {
            fVar1 = C[uVar13];
            if (fVar1 <= fVar23) {
              fVar23 = fVar1;
            }
            if (fVar22 <= fVar1) {
              fVar22 = fVar1;
            }
          }
          if (fVar23 <= 0.0) {
            iVar11 = -8;
            goto LAB_0010808f;
          }
          if ((int)uVar5 < 1) {
            colcnd = 1.0;
          }
          else {
            if (fVar23 <= in_XMM0_Da) {
              fVar23 = in_XMM0_Da;
            }
            if (in_XMM1_Da <= fVar22) {
              fVar22 = in_XMM1_Da;
            }
            colcnd = fVar23 / fVar22;
          }
        }
        else {
LAB_00107fbf:
          if (iVar11 != 0) goto LAB_00108092;
        }
        if (lwork < -1) {
          iVar11 = -0xc;
        }
        else {
          iVar4 = B->ncol;
          iVar11 = -0xd;
          if (-1 < iVar4) {
            iVar15 = 0;
            if (0 < A->nrow) {
              iVar15 = A->nrow;
            }
            if ((((iVar15 <= *piVar12) && (B->Stype == SLU_DN)) && (B->Dtype == SLU_S)) &&
               (B->Mtype == SLU_GE)) {
              iVar11 = -0xe;
              if ((((-1 < X->ncol) && (iVar15 <= *piVar6)) &&
                  ((iVar4 == 0 || iVar4 == X->ncol && ((X->Stype == SLU_DN && (X->Dtype == SLU_S))))
                  )) && (X->Mtype == SLU_GE)) {
                local_170 = sp_ienv(1);
                local_174 = sp_ienv(2);
                local_1c0 = stat->utime;
                if (A->Stype == SLU_NR) {
                  bVar18 = (int)local_198 != 0;
                  local_1a0 = (trans_t)((int)local_198 == 0);
                  piVar7 = (int_t *)A->Store;
                  local_210 = (SuperMatrix *)superlu_malloc(0x20);
                  sCreate_CompCol_Matrix
                            (local_210,A->ncol,A->nrow,*piVar7,*(float **)(piVar7 + 2),
                             *(int_t **)(piVar7 + 4),*(int_t **)(piVar7 + 6),SLU_NC,A->Dtype,
                             A->Mtype);
                }
                else {
                  local_1a0 = options->Trans;
                  local_210 = A;
                }
                if (local_19c == FACTORED) goto LAB_00108631;
                if ((int)local_1d0 == 1) {
                  puVar8 = (undefined4 *)local_210->Store;
                  local_1b8 = CONCAT44(local_1b8._4_4_,*puVar8);
                  local_1d0 = *(int_t **)(puVar8 + 6);
                  piVar7 = *(int_t **)(puVar8 + 4);
                  local_198 = *(float **)(puVar8 + 2);
                  local_160 = SuperLU_timer_();
                  local_218 = int32Malloc(n);
                  if (local_218 == (int *)0x0) {
                    sprintf(norm,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for perm[]",
                            0x227,
                            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sgsisx.c"
                           );
                    superlu_abort_and_exit(norm);
                  }
                  info1 = sldperm(5,n,(int_t)local_1b8,local_1d0,piVar7,local_198,local_218,R,C);
                  if (info1 == 0) {
                    local_1b8 = 0;
                    if (0 < (int)n) {
                      local_1b8 = (ulong)n;
                    }
                    if (yVar3 == YES) {
                      for (uVar13 = 0; local_1b8 != uVar13; uVar13 = uVar13 + 1) {
                        dVar24 = exp((double)R[uVar13]);
                        R[uVar13] = (float)dVar24;
                        dVar24 = exp((double)C[uVar13]);
                        C[uVar13] = (float)dVar24;
                      }
                      uVar13 = 0;
                      while (uVar14 = uVar13, uVar14 != local_1b8) {
                        iVar11 = local_1d0[uVar14 + 1];
                        for (lVar16 = (long)local_1d0[uVar14]; uVar13 = uVar14 + 1, lVar16 < iVar11;
                            lVar16 = lVar16 + 1) {
                          local_198[lVar16] = R[piVar7[lVar16]] * C[uVar14] * local_198[lVar16];
                        }
                      }
                      *equed = 'B';
                      bVar20 = true;
                      bVar21 = bVar20;
                    }
                    uVar13 = 0;
                    while (uVar13 != local_1b8) {
                      piVar12 = local_1d0 + uVar13;
                      uVar13 = uVar13 + 1;
                      for (lVar16 = (long)*piVar12; lVar16 < local_1d0[uVar13]; lVar16 = lVar16 + 1)
                      {
                        piVar7[lVar16] = local_218[piVar7[lVar16]];
                      }
                    }
                  }
                  else {
                    superlu_free(local_218);
                    bVar19 = true;
                    local_218 = (int *)0x0;
                  }
                  dVar24 = SuperLU_timer_();
                  local_1c0[4] = dVar24 - local_160;
                }
                else {
                  local_218 = (int *)0x0;
                  bVar19 = true;
                }
                if ((bool)(yVar3 == YES & bVar19)) {
                  dVar24 = SuperLU_timer_();
                  sgsequ(local_210,R,C,&rowcnd,&colcnd,&amax,&info1);
                  if (info1 == 0) {
                    slaqgs(local_210,R,C,rowcnd,colcnd,amax,equed);
                    cVar2 = *equed;
                    if (cVar2 == 'R') {
                      bVar21 = true;
                    }
                    else {
                      bVar21 = cVar2 == 'B';
                      if (cVar2 == 'C') {
                        bVar20 = true;
                        goto LAB_001083e0;
                      }
                    }
                    bVar20 = cVar2 == 'B';
                  }
LAB_001083e0:
                  dVar25 = SuperLU_timer_();
                  local_1c0[4] = dVar25 - dVar24;
                }
                dVar24 = SuperLU_timer_();
                if ((options->ColPerm != MY_PERMC) && (options->Fact == DOFACT)) {
                  get_perm_c(options->ColPerm,local_210,local_1b0);
                }
                dVar25 = SuperLU_timer_();
                pdVar10 = local_1c0;
                *local_1c0 = dVar25 - dVar24;
                dVar24 = SuperLU_timer_();
                sp_preorder(options,local_210,local_1b0,local_168,&AC);
                dVar25 = SuperLU_timer_();
                pdVar10[3] = dVar25 - dVar24;
                dVar24 = SuperLU_timer_();
                sgsitrf(options,&AC,local_174,local_170,local_168,work,lwork,local_1b0,local_188,L,U
                        ,Glu,stat,info);
                dVar25 = SuperLU_timer_();
                pdVar10[7] = dVar25 - dVar24;
                if (lwork == -1) {
                  mem_usage->total_needed = (float)(*info - A->ncol);
                  return;
                }
                if (!bVar19) {
                  uVar5 = *local_210->Store;
                  lVar16 = *(long *)((long)local_210->Store + 0x10);
                  piVar12 = int32Malloc(n * 2);
                  if (piVar12 == (int *)0x0) {
                    sprintf(norm,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for perm_tmp[]",
                            0x27e,
                            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sgsisx.c"
                           );
                    superlu_abort_and_exit(norm);
                  }
                  uVar13 = 0;
                  uVar14 = 0;
                  if (0 < (int)n) {
                    uVar14 = (ulong)n;
                  }
                  for (; uVar14 != uVar13; uVar13 = uVar13 + 1) {
                    piVar12[uVar13] = local_188[local_218[uVar13]];
                  }
                  for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
                    local_188[uVar13] = piVar12[uVar13];
                    piVar12[(long)(int)n + (long)local_218[uVar13]] = (int)uVar13;
                  }
                  uVar14 = 0;
                  uVar13 = (ulong)uVar5;
                  if ((int)uVar5 < 1) {
                    uVar13 = uVar14;
                  }
                  for (; uVar13 != uVar14; uVar14 = uVar14 + 1) {
                    *(int *)(lVar16 + uVar14 * 4) =
                         piVar12[(long)(int)n + (long)*(int *)(lVar16 + uVar14 * 4)];
                  }
                  superlu_free(local_218);
                  superlu_free(piVar12);
                }
LAB_00108631:
                if (options->PivotGrowth != NO) {
                  if (0 < *info) {
                    return;
                  }
                  fVar22 = sPivotGrowth(A->ncol,local_210,local_1b0,L,U);
                  *recip_pivot_growth = fVar22;
                }
                if (options->ConditionNumber != NO) {
                  dVar24 = SuperLU_timer_();
                  uVar9 = 0x49;
                  if (bVar18) {
                    uVar9 = 0x31;
                  }
                  _norm = CONCAT31(uStack_137,uVar9);
                  fVar22 = slangs(norm,local_210);
                  sgscon(norm,L,U,fVar22,rcond,stat,&info1);
                  dVar25 = SuperLU_timer_();
                  local_1c0[0x10] = dVar25 - dVar24;
                }
                if (0 < (int)local_1c8) {
                  if (bVar18) {
                    if (bVar21) {
                      uVar13 = 0;
                      uVar14 = 0;
                      if (0 < (int)n) {
                        uVar14 = (ulong)n;
                      }
                      lVar16 = local_1e8;
                      for (; uVar13 != local_1c8; uVar13 = uVar13 + 1) {
                        for (uVar17 = 0; uVar14 != uVar17; uVar17 = uVar17 + 1) {
                          *(float *)(lVar16 + uVar17 * 4) =
                               R[uVar17] * *(float *)(lVar16 + uVar17 * 4);
                        }
                        lVar16 = lVar16 + local_190 * 4;
                      }
                    }
                  }
                  else if (bVar20) {
                    uVar13 = 0;
                    uVar14 = 0;
                    if (0 < (int)n) {
                      uVar14 = (ulong)n;
                    }
                    lVar16 = local_1e8;
                    for (; uVar13 != local_1c8; uVar13 = uVar13 + 1) {
                      for (uVar17 = 0; uVar14 != uVar17; uVar17 = uVar17 + 1) {
                        *(float *)(lVar16 + uVar17 * 4) =
                             C[uVar17] * *(float *)(lVar16 + uVar17 * 4);
                      }
                      lVar16 = lVar16 + local_190 * 4;
                    }
                  }
                  uVar14 = 0;
                  uVar13 = (ulong)(uint)B->nrow;
                  if (B->nrow < 1) {
                    uVar13 = uVar14;
                  }
                  local_180 = local_180 * 4;
                  local_190 = local_190 * 4;
                  lVar16 = local_1a8;
                  for (; uVar14 != local_1c8; uVar14 = uVar14 + 1) {
                    for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
                      *(undefined4 *)(lVar16 + uVar17 * 4) = *(undefined4 *)(local_1e8 + uVar17 * 4)
                      ;
                    }
                    lVar16 = lVar16 + local_180;
                    local_1e8 = local_1e8 + local_190;
                  }
                  dVar24 = SuperLU_timer_();
                  sgstrs(local_1a0,L,U,local_1b0,local_188,X,stat,&info1);
                  dVar25 = SuperLU_timer_();
                  local_1c0[0x11] = dVar25 - dVar24;
                  if (bVar18) {
                    if (bVar20) {
                      uVar14 = 0;
                      uVar13 = (ulong)n;
                      if ((int)n < 1) {
                        uVar13 = uVar14;
                      }
                      for (; uVar14 != local_1c8; uVar14 = uVar14 + 1) {
                        for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
                          *(float *)(local_1a8 + uVar17 * 4) =
                               C[uVar17] * *(float *)(local_1a8 + uVar17 * 4);
                        }
                        local_1a8 = local_1a8 + local_180;
                      }
                    }
                  }
                  else if (bVar21) {
                    uVar14 = 0;
                    uVar13 = (ulong)(uint)A->nrow;
                    if (A->nrow < 1) {
                      uVar13 = uVar14;
                    }
                    for (; uVar14 != local_1c8; uVar14 = uVar14 + 1) {
                      for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
                        *(float *)(local_1a8 + uVar17 * 4) =
                             R[uVar17] * *(float *)(local_1a8 + uVar17 * 4);
                      }
                      local_1a8 = local_1a8 + local_180;
                    }
                  }
                }
                if (((options->ConditionNumber != NO) &&
                    (fVar22 = *rcond, fVar23 = smach("E"), fVar22 < fVar23)) && (*info == 0)) {
                  *info = A->ncol + 1;
                }
                if (local_19c != FACTORED) {
                  ilu_sQuerySpace(L,U,mem_usage);
                  Destroy_CompCol_Permuted(&AC);
                }
                if (A->Stype != SLU_NR) {
                  return;
                }
                Destroy_SuperMatrix_Store(local_210);
                superlu_free(local_210);
                return;
              }
            }
          }
        }
      }
      else {
        if (*equed == 'N') {
          iVar11 = *info;
          goto LAB_00107fbf;
        }
        iVar11 = -6;
      }
    }
  }
LAB_0010808f:
  *info = iVar11;
LAB_00108092:
  _norm = -iVar11;
  input_error("sgsisx",(int *)norm);
  return;
}

Assistant:

void
sgsisx(superlu_options_t *options, SuperMatrix *A, int *perm_c, int *perm_r,
       int *etree, char *equed, float *R, float *C,
       SuperMatrix *L, SuperMatrix *U, void *work, int_t lwork,
       SuperMatrix *B, SuperMatrix *X,
       float *recip_pivot_growth, float *rcond,
       GlobalLU_t *Glu, mem_usage_t *mem_usage, SuperLUStat_t *stat, int_t *info)
{

    DNformat  *Bstore, *Xstore;
    float    *Bmat, *Xmat;
    int       ldb, ldx, nrhs, n;
    SuperMatrix *AA;/* A in SLU_NC format used by the factorization routine.*/
    SuperMatrix AC; /* Matrix postmultiplied by Pc */
    int       colequ, equil, nofact, notran, rowequ, permc_spec, mc64;
    trans_t   trant;
    char      norm[1];
    int_t     i, j;
    float    amax, anorm, bignum, smlnum, colcnd, rowcnd, rcmax, rcmin;
    int       relax, panel_size, info1;
    double    t0;      /* temporary time */
    double    *utime;

    int *perm = NULL; /* permutation returned from MC64 */

    /* External functions */
    extern float slangs(char *, SuperMatrix *);

    Bstore = B->Store;
    Xstore = X->Store;
    Bmat   = Bstore->nzval;
    Xmat   = Xstore->nzval;
    ldb    = Bstore->lda;
    ldx    = Xstore->lda;
    nrhs   = B->ncol;
    n      = B->nrow;

    *info = 0;
    nofact = (options->Fact != FACTORED);
    equil = (options->Equil == YES);
    notran = (options->Trans == NOTRANS);
    mc64 = (options->RowPerm == LargeDiag_MC64);
    if ( nofact ) {
	*(unsigned char *)equed = 'N';
	rowequ = FALSE;
	colequ = FALSE;
    } else {
	rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
	colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	smlnum = smach("Safe minimum");  /* lamch_("Safe minimum"); */
	bignum = 1. / smlnum;
    }

    /* Test the input parameters */
    if ( (options->Fact != DOFACT && options->Fact != SamePattern &&
	  options->Fact != SamePattern_SameRowPerm &&
	  options->Fact != FACTORED) ||
	 (options->Trans != NOTRANS && options->Trans != TRANS && 
	  options->Trans != CONJ) ||
	 (options->Equil != NO && options->Equil != YES) )
	*info = -1;
    else if ( A->nrow != A->ncol || A->nrow < 0 ||
	      (A->Stype != SLU_NC && A->Stype != SLU_NR) ||
	      A->Dtype != SLU_S || A->Mtype != SLU_GE )
	*info = -2;
    else if ( options->Fact == FACTORED &&
	     !(rowequ || colequ || strncmp(equed, "N", 1)==0) )
	*info = -6;
    else {
	if (rowequ) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, R[j]);
		rcmax = SUPERLU_MAX(rcmax, R[j]);
	    }
	    if (rcmin <= 0.) *info = -7;
	    else if ( A->nrow > 0)
		rowcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else rowcnd = 1.;
	}
	if (colequ && *info == 0) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, C[j]);
		rcmax = SUPERLU_MAX(rcmax, C[j]);
	    }
	    if (rcmin <= 0.) *info = -8;
	    else if (A->nrow > 0)
		colcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else colcnd = 1.;
	}
	if (*info == 0) {
	    if ( lwork < -1 ) *info = -12;
	    else if ( B->ncol < 0 || Bstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      B->Stype != SLU_DN || B->Dtype != SLU_S || 
		      B->Mtype != SLU_GE )
		*info = -13;
	    else if ( X->ncol < 0 || Xstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      (B->ncol != 0 && B->ncol != X->ncol) ||
		      X->Stype != SLU_DN ||
		      X->Dtype != SLU_S || X->Mtype != SLU_GE )
		*info = -14;
	}
    }
    if (*info != 0) {
	int ii = -(*info);
	input_error("sgsisx", &ii);
	return;
    }

    /* Initialization for factor parameters */
    panel_size = sp_ienv(1);
    relax      = sp_ienv(2);

    utime = stat->utime;

    /* Convert A to SLU_NC format when necessary. */
    if ( A->Stype == SLU_NR ) {
	NRformat *Astore = A->Store;
	AA = (SuperMatrix *) SUPERLU_MALLOC( sizeof(SuperMatrix) );
	sCreate_CompCol_Matrix(AA, A->ncol, A->nrow, Astore->nnz,
			       Astore->nzval, Astore->colind, Astore->rowptr,
			       SLU_NC, A->Dtype, A->Mtype);
	if ( notran ) { /* Reverse the transpose argument. */
	    trant = TRANS;
	    notran = 0;
	} else {
	    trant = NOTRANS;
	    notran = 1;
	}
    } else { /* A->Stype == SLU_NC */
	trant = options->Trans;
	AA = A;
    }

    if ( nofact ) {
	register int i, j;
	NCformat *Astore = AA->Store;
	int_t nnz = Astore->nnz;
	int_t *colptr = Astore->colptr;
	int_t *rowind = Astore->rowind;
	float *nzval = (float *)Astore->nzval;

	if ( mc64 ) {
	    t0 = SuperLU_timer_();
	    if ((perm = int32Malloc(n)) == NULL)
		ABORT("SUPERLU_MALLOC fails for perm[]");

	    info1 = sldperm(5, n, nnz, colptr, rowind, nzval, perm, R, C);

	    if (info1 != 0) { /* MC64 fails, call sgsequ() later */
		mc64 = 0;
		SUPERLU_FREE(perm);
		perm = NULL;
	    } else {
	        if ( equil ) {
	            rowequ = colequ = 1;
		    for (i = 0; i < n; i++) {
		        R[i] = exp(R[i]);
		        C[i] = exp(C[i]);
		    }
		    /* scale the matrix */
		    for (j = 0; j < n; j++) {
		        for (i = colptr[j]; i < colptr[j + 1]; i++) {
			    nzval[i] *= R[rowind[i]] * C[j];
		        }
		    }
	            *equed = 'B';
                }

                /* permute the matrix */
		for (j = 0; j < n; j++) {
		    for (i = colptr[j]; i < colptr[j + 1]; i++) {
			/*nzval[i] *= R[rowind[i]] * C[j];*/
			rowind[i] = perm[rowind[i]];
		    }
		}
	    }
	    utime[EQUIL] = SuperLU_timer_() - t0;
	}

	if ( mc64==0 && equil ) { /* Only perform equilibration, no row perm */
	    t0 = SuperLU_timer_();
	    /* Compute row and column scalings to equilibrate the matrix A. */
	    sgsequ(AA, R, C, &rowcnd, &colcnd, &amax, &info1);

	    if ( info1 == 0 ) {
		/* Equilibrate matrix A. */
		slaqgs(AA, R, C, rowcnd, colcnd, amax, equed);
		rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
		colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	    }
	    utime[EQUIL] = SuperLU_timer_() - t0;
	}
    }


    if ( nofact ) {
	
	t0 = SuperLU_timer_();
	/*
	 * Gnet column permutation vector perm_c[], according to permc_spec:
	 *   permc_spec = NATURAL:  natural ordering 
	 *   permc_spec = MMD_AT_PLUS_A: minimum degree on structure of A'+A
	 *   permc_spec = MMD_ATA:  minimum degree on structure of A'*A
	 *   permc_spec = COLAMD:   approximate minimum degree column ordering
	 *   permc_spec = MY_PERMC: the ordering already supplied in perm_c[]
	 */
	permc_spec = options->ColPerm;
	if ( permc_spec != MY_PERMC && options->Fact == DOFACT )
	    get_perm_c(permc_spec, AA, perm_c);
	utime[COLPERM] = SuperLU_timer_() - t0;

	t0 = SuperLU_timer_();
	sp_preorder(options, AA, perm_c, etree, &AC);
	utime[ETREE] = SuperLU_timer_() - t0;

	/* Compute the LU factorization of A*Pc. */
	t0 = SuperLU_timer_();
	sgsitrf(options, &AC, relax, panel_size, etree, work, lwork,
                perm_c, perm_r, L, U, Glu, stat, info);
	utime[FACT] = SuperLU_timer_() - t0;

	if ( lwork == -1 ) {
	    mem_usage->total_needed = *info - A->ncol;
	    return;
	}

	if ( mc64 ) { /* Fold MC64's perm[] into perm_r[]. */
	    NCformat *Astore = AA->Store;
	    int_t nnz = Astore->nnz, *rowind = Astore->rowind;
	    int *perm_tmp, *iperm;
	    if ((perm_tmp = int32Malloc(2*n)) == NULL)
		ABORT("SUPERLU_MALLOC fails for perm_tmp[]");
	    iperm = perm_tmp + n;
	    for (i = 0; i < n; ++i) perm_tmp[i] = perm_r[perm[i]];
	    for (i = 0; i < n; ++i) {
		perm_r[i] = perm_tmp[i];
		iperm[perm[i]] = i;
	    }

	    /* Restore A's original row indices. */
	    for (i = 0; i < nnz; ++i) rowind[i] = iperm[rowind[i]];

	    SUPERLU_FREE(perm); /* MC64 permutation */
	    SUPERLU_FREE(perm_tmp);
	}
    }

    if ( options->PivotGrowth ) {
	if ( *info > 0 ) return;

	/* Compute the reciprocal pivot growth factor *recip_pivot_growth. */
	*recip_pivot_growth = sPivotGrowth(A->ncol, AA, perm_c, L, U);
    }

    if ( options->ConditionNumber ) {
	/* Estimate the reciprocal of the condition number of A. */
	t0 = SuperLU_timer_();
	if ( notran ) {
	    *(unsigned char *)norm = '1';
	} else {
	    *(unsigned char *)norm = 'I';
	}
	anorm = slangs(norm, AA);
	sgscon(norm, L, U, anorm, rcond, stat, &info1);
	utime[RCOND] = SuperLU_timer_() - t0;
    }

    if ( nrhs > 0 ) { /* Solve the system */

	/* Scale and permute the right-hand side if equilibration
           and permutation from MC64 were performed. */
	if ( notran ) {
	    if ( rowequ ) {
		for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < n; ++i)
		        Bmat[i + j*ldb] *= R[i];
	    }
	} else if ( colequ ) {
	    for (j = 0; j < nrhs; ++j)
		for (i = 0; i < n; ++i) {
	            Bmat[i + j*ldb] *= C[i];
		}
	}

	/* Compute the solution matrix X. */
	for (j = 0; j < nrhs; j++)  /* Save a copy of the right hand sides */
	    for (i = 0; i < B->nrow; i++)
		Xmat[i + j*ldx] = Bmat[i + j*ldb];

	t0 = SuperLU_timer_();
	sgstrs (trant, L, U, perm_c, perm_r, X, stat, &info1);
	utime[SOLVE] = SuperLU_timer_() - t0;

	/* Transform the solution matrix X to a solution of the original
	   system. */
	if ( notran ) {
	    if ( colequ ) {
		for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < n; ++i) {
                        Xmat[i + j*ldx] *= C[i];
                    }
	    }
	} else { /* transposed system */
	    if ( rowequ ) {
	        for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < A->nrow; ++i) {
              	        Xmat[i + j*ldx] *= R[i];
                    }
	    }
	}

    } /* end if nrhs > 0 */

    if ( options->ConditionNumber ) {
	/* The matrix is singular to working precision. */
	/* if ( *rcond < slamch_("E") && *info == 0) *info = A->ncol + 1; */
	if ( *rcond < smach("E") && *info == 0) *info = A->ncol + 1;
    }

    if ( nofact ) {
	ilu_sQuerySpace(L, U, mem_usage);
	Destroy_CompCol_Permuted(&AC);
    }
    if ( A->Stype == SLU_NR ) {
	Destroy_SuperMatrix_Store(AA);
	SUPERLU_FREE(AA);
    }

}